

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardplural.cpp
# Opt level: O1

int32_t icu_63::StandardPlural::indexOrNegativeFromString(UnicodeString *keyword)

{
  short sVar1;
  int8_t iVar2;
  char cVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  
  sVar1 = (keyword->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (keyword->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 == 5) {
    iVar5 = 5;
    cVar3 = UnicodeString::doCompare(keyword,0,5,(UChar *)gOther,0,5);
  }
  else if (iVar4 == 4) {
    iVar2 = UnicodeString::doCompare(keyword,0,4,L"manyzeroother睴o敦w慭祮漀桴牥",0,4);
    if (iVar2 == '\0') {
      return 4;
    }
    sVar1 = (keyword->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (keyword->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    iVar5 = 0;
    cVar3 = UnicodeString::doCompare(keyword,0,iVar6,L"zeroother睴o敦w慭祮漀桴牥",0,4);
  }
  else {
    if (iVar4 != 3) {
      return -1;
    }
    iVar2 = UnicodeString::doCompare
                      (keyword,0,3,L"onetwofewmanyzeroother睴o敦w慭祮漀桴牥",0,3);
    if (iVar2 == '\0') {
      return 1;
    }
    sVar1 = (keyword->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (keyword->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doCompare
                      (keyword,0,iVar5,L"twofewmanyzeroother睴o敦w慭祮漀桴牥",0,3);
    if (iVar2 == '\0') {
      return 2;
    }
    sVar1 = (keyword->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (keyword->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    iVar5 = 3;
    cVar3 = UnicodeString::doCompare(keyword,0,iVar6,L"fewmanyzeroother睴o敦w慭祮漀桴牥",0,3)
    ;
  }
  if (cVar3 != '\0') {
    return -1;
  }
  return iVar5;
}

Assistant:

int32_t StandardPlural::indexOrNegativeFromString(const UnicodeString &keyword) {
    switch (keyword.length()) {
    case 3:
        if (keyword.compare(gOne, 3) == 0) {
            return ONE;
        } else if (keyword.compare(gTwo, 3) == 0) {
            return TWO;
        } else if (keyword.compare(gFew, 3) == 0) {
            return FEW;
        }
        break;
    case 4:
        if (keyword.compare(gMany, 4) == 0) {
            return MANY;
        } else if (keyword.compare(gZero, 4) == 0) {
            return ZERO;
        }
        break;
    case 5:
        if (keyword.compare(gOther, 5) == 0) {
            return OTHER;
        }
        break;
    default:
        break;
    }
    return -1;
}